

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O3

void __thiscall
cmTargetPropCommandBase::HandleInterfaceContent
          (cmTargetPropCommandBase *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  long *plVar1;
  char *pcVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  size_type *psVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined7 in_register_00000081;
  string totalContent;
  string propName;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT71(in_register_00000009,prepend) == 0) {
    std::operator+(&local_b0,"INTERFACE_",&this->Property);
    (*(this->super_cmCommand)._vptr_cmCommand[10])(&local_d0,this,content);
    cmTarget::AppendProperty(tgt,&local_b0,(char *)local_d0,false);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    goto LAB_0028e212;
  }
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"INTERFACE_","",CONCAT71(in_register_00000009,prepend),
             CONCAT71(in_register_00000081,param_4));
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(this->Property)._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar1[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  pcVar2 = cmTarget::GetProperty(tgt,&local_b0);
  (*(this->super_cmCommand)._vptr_cmCommand[10])(&local_70,this,content);
  if (pcVar2 == (char *)0x0) {
    local_90 = &local_80;
    local_88 = 0;
    local_80 = local_80 & 0xffffffffffffff00;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,";","");
    plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
    local_90 = &local_80;
    puVar5 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar5) {
      local_80 = *puVar5;
      lStack_78 = plVar1[3];
    }
    else {
      local_80 = *puVar5;
      local_90 = (ulong *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)puVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
  }
  uVar6 = 0xf;
  if (local_70 != local_60) {
    uVar6 = local_60[0];
  }
  if (uVar6 < (ulong)(local_88 + local_68)) {
    uVar6 = 0xf;
    if (local_90 != &local_80) {
      uVar6 = local_80;
    }
    if (uVar6 < (ulong)(local_88 + local_68)) goto LAB_0028e36b;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0028e36b:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_c0 = *plVar1;
    uStack_b8 = puVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar1;
    local_d0 = (long *)*puVar3;
  }
  local_c8 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((pcVar2 != (char *)0x0) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  cmTarget::SetProperty(tgt,&local_b0,(char *)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    return;
  }
LAB_0028e212:
  operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmTargetPropCommandBase::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  if (prepend) {
    const std::string propName = std::string("INTERFACE_") + this->Property;
    const char* propValue = tgt->GetProperty(propName);
    const std::string totalContent = this->Join(content) +
      (propValue ? std::string(";") + propValue : std::string());
    tgt->SetProperty(propName, totalContent.c_str());
  } else {
    tgt->AppendProperty("INTERFACE_" + this->Property,
                        this->Join(content).c_str());
  }
}